

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::disp_data_source_t::set_data_sources_name_base(disp_data_source_t *this,string *name_base)

{
  string local_68 [32];
  prefix_t local_48;
  string *local_18;
  string *name_base_local;
  disp_data_source_t *this_local;
  
  local_18 = name_base;
  name_base_local = (string *)this;
  std::__cxx11::string::string(local_68,(string *)name_base);
  reuse::make_disp_prefix(&local_48,"pdt-opp",(string *)local_68,this->m_dispatcher);
  memcpy(&this->m_base_prefix,&local_48,0x30);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void
				set_data_sources_name_base(
					const std::string & name_base )
					{
						using namespace so_5::disp::reuse;

						m_base_prefix = make_disp_prefix(
								"pdt-opp",
								name_base,
								&m_dispatcher );
					}